

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardCommon.cpp
# Opt level: O2

void leopard::InitializeCPUArch(void)

{
  long lVar1;
  
  lVar1 = cpuid_Version_info(1);
  CpuHasSSSE3 = (byte)(*(uint *)(lVar1 + 0xc) >> 9) & 1;
  lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
  CpuHasAVX2 = (byte)*(undefined4 *)(lVar1 + 4) >> 5 & 1;
  return;
}

Assistant:

void InitializeCPUArch()
{
#if defined(LEO_TRY_NEON) && defined(HAVE_ANDROID_GETCPUFEATURES)
    AndroidCpuFamily family = android_getCpuFamily();
    if (family == ANDROID_CPU_FAMILY_ARM)
    {
        if (android_getCpuFeatures() & ANDROID_CPU_ARM_FEATURE_NEON)
            CpuHasNeon = true;
    }
    else if (family == ANDROID_CPU_FAMILY_ARM64)
    {
        CpuHasNeon = true;
        if (android_getCpuFeatures() & ANDROID_CPU_ARM64_FEATURE_ASIMD)
            CpuHasNeon64 = true;
    }
#endif

#if !defined(LEO_TARGET_MOBILE)
    unsigned int cpu_info[4];

    _cpuid(cpu_info, 1);
    CpuHasSSSE3 = ((cpu_info[2] & CPUID_ECX_SSSE3) != 0);

#if defined(LEO_TRY_AVX2)
    _cpuid(cpu_info, 7);
    CpuHasAVX2 = ((cpu_info[1] & CPUID_EBX_AVX2) != 0);
#endif // LEO_TRY_AVX2

#ifndef LEO_USE_SSSE3_OPT
    CpuHasSSSE3 = false;
#endif // LEO_USE_SSSE3_OPT
#ifndef LEO_USE_AVX2_OPT
    CpuHasAVX2 = false;
#endif // LEO_USE_AVX2_OPT

#endif // LEO_TARGET_MOBILE
}